

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::resize_symms_tmpl<2,3>(Omega_h *this,Reals *old_symms)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_c0;
  undefined1 local_b0 [8];
  type f;
  int min_dim;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<double> new_symms;
  int n;
  Reals *old_symms_local;
  ulong local_10;
  
  if (((ulong)(old_symms->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((old_symms->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(old_symms->write_).shared_alloc_.alloc >> 3;
  }
  new_symms.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_10 >> 3),3);
  size_in = new_symms.shared_alloc_.direct_ptr._4_4_ * 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<double>::Write((Write<double> *)local_58,size_in,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  f.new_symms.shared_alloc_.direct_ptr._0_4_ = 2;
  Read<double>::Read((Read<double> *)local_b0,old_symms);
  Write<double>::Write
            ((Write<double> *)&f.old_symms.write_.shared_alloc_.direct_ptr,(Write<double> *)local_58
            );
  parallel_for<Omega_h::resize_symms_tmpl<2,3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (new_symms.shared_alloc_.direct_ptr._4_4_,(type *)local_b0,"resize_symms");
  Write<double>::Write(&local_c0,(Write<signed_char> *)local_58);
  Read<double>::Read((Read<double> *)this,&local_c0);
  Write<double>::~Write(&local_c0);
  resize_symms_tmpl<2,3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_b0)
  ;
  Write<double>::~Write((Write<double> *)local_58);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals resize_symms_tmpl(Reals old_symms) {
  auto n = divide_no_remainder(old_symms.size(), symm_ncomps(old_dim));
  Write<Real> new_symms(n * symm_ncomps(new_dim));
  constexpr auto min_dim = min2(old_dim, new_dim);
  auto f = OMEGA_H_LAMBDA(Int i) {
    auto a = get_symm<old_dim>(old_symms, i);
    auto b = zero_matrix<new_dim, new_dim>();
    for (Int j = 0; j < min_dim; ++j) {
      for (Int k = 0; k < min_dim; ++k) {
        b[j][k] = a[j][k];
      }
    }
    set_symm(new_symms, i, b);
  };
  parallel_for(n, f, "resize_symms");
  return new_symms;
}